

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralCurveConnection::~IfcStructuralCurveConnection
          (IfcStructuralCurveConnection *this)

{
  IfcObject::~IfcObject((IfcObject *)this,&PTR_construction_vtable_24__00826e30);
  return;
}

Assistant:

IfcStructuralCurveConnection() : Object("IfcStructuralCurveConnection") {}